

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_agents.c
# Opt level: O0

REF_STATUS ref_agents_tattle(REF_AGENTS ref_agents,REF_INT id,char *context)

{
  char *context_local;
  REF_INT id_local;
  REF_AGENTS ref_agents_local;
  
  printf("%d: %d id %d mode %d home %d node %d part %d seed %ld global %f %f %f %s\n",
         ref_agents->agent[id].xyz[1],ref_agents->agent[id].xyz[1],ref_agents->agent[id].xyz[2],
         (ulong)(uint)ref_agents->ref_mpi->id,(ulong)(uint)id,(ulong)ref_agents->agent[id].mode,
         (ulong)(uint)ref_agents->agent[id].home,(ulong)(uint)ref_agents->agent[id].node,
         ref_agents->agent[id].part,ref_agents->agent[id].seed,ref_agents->agent[id].global,context)
  ;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_agents_tattle(REF_AGENTS ref_agents, REF_INT id,
                                     const char *context) {
  printf("%d: %d id %d mode %d home %d node %d part %d seed " REF_GLOB_FMT
         " global %f %f %f "
         "%s\n",
         ref_mpi_rank(ref_agents->ref_mpi), id,
         (int)ref_agent_mode(ref_agents, id), ref_agent_home(ref_agents, id),
         ref_agent_node(ref_agents, id), ref_agent_part(ref_agents, id),
         ref_agent_seed(ref_agents, id), ref_agent_global(ref_agents, id),
         ref_agent_xyz(ref_agents, 1, id), ref_agent_xyz(ref_agents, 1, id),
         ref_agent_xyz(ref_agents, 2, id), context);
  return REF_SUCCESS;
}